

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

void __thiscall net_uv::Socket::~Socket(Socket *this)

{
  Socket *this_local;
  
  this->_vptr_Socket = (_func_int **)&PTR__Socket_00203bd8;
  std::function<void_(char_*,_long)>::~function(&this->m_recvCall);
  std::function<void_(net_uv::Socket_*)>::~function(&this->m_closeCall);
  std::function<void_(net_uv::Socket_*,_int)>::~function(&this->m_connectCall);
  std::__cxx11::string::~string((string *)&this->m_ip);
  return;
}

Assistant:

Socket::~Socket()
{
}